

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

set_icase *
get_script_dependencies
          (set_icase *__return_storage_ptr__,string *fname,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchedScripts,set_icase *hud_files)

{
  _Rb_tree_header *p_Var1;
  string *str;
  pointer *ppbVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  istream *piVar10;
  long lVar11;
  long lVar12;
  iterator iVar13;
  ulong uVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  string *psVar18;
  string *psVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  int i;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined1 local_bf8 [8];
  ifstream myfile;
  undefined1 local_9f0 [8];
  set_icase includeRes;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  string local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  string folder;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string trace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret1;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret2;
  string spr;
  undefined1 auStack_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 local_120 [8];
  string sprite_val;
  undefined1 local_f0 [8];
  string tmpVal;
  string sound_val;
  int local_a8;
  undefined1 local_a0 [8];
  string ext;
  string concatVal;
  undefined1 local_58 [8];
  string include;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  include.field_2._8_8_ = __return_storage_ptr__;
  std::__cxx11::string::string((string *)local_228,"scripts/maps/",(allocator *)local_bf8);
  std::__cxx11::string::string((string *)&local_7a8,(string *)fname);
  toLowerCase((string *)local_bf8,&local_7a8);
  lVar9 = std::__cxx11::string::find((char *)local_bf8,0x12c88b);
  std::__cxx11::string::~string((string *)local_bf8);
  std::__cxx11::string::~string((string *)&local_7a8);
  iVar8 = std::__cxx11::string::find_last_of((char *)fname,0x12c117);
  if ((iVar8 != -1) && (folder._M_dataplus._M_p < (pointer)(long)iVar8)) {
    std::__cxx11::string::substr((ulong)local_9f0,(ulong)fname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0,
                   '/');
    std::__cxx11::string::operator=((string *)local_228,(string *)local_bf8);
    std::__cxx11::string::~string((string *)local_bf8);
    std::__cxx11::string::~string((string *)local_9f0);
  }
  contentExists(fname,true,&dummy_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)
             &parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)fname);
  std::ifstream::ifstream(local_bf8,(string *)fname,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
LAB_001271ca:
    std::ifstream::close();
    std::ifstream::~ifstream(local_bf8);
    std::__cxx11::string::~string
              ((string *)
               &parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_228);
    return (set_icase *)include.field_2._8_8_;
  }
  folder.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  bVar4 = false;
  str = (string *)(folder.field_2._M_local_buf + 8);
  local_a8 = 0;
  sprite_val.field_2._8_8_ = searchedScripts;
  do {
    do {
      do {
        do {
          piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_bf8,(string *)str);
          if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
            std::__cxx11::string::~string((string *)(folder.field_2._M_local_buf + 8));
            goto LAB_001271ca;
          }
          std::__cxx11::string::string((string *)&local_788,(string *)str);
          trimSpaces((string *)local_9f0,&local_788);
          local_a8 = local_a8 + 1;
          std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
          std::__cxx11::string::~string((string *)local_9f0);
          std::__cxx11::string::~string((string *)&local_788);
          lVar11 = std::__cxx11::string::find((char *)str,0x12b2c2);
        } while (lVar11 == 0);
        while( true ) {
          lVar11 = std::__cxx11::string::find((char *)str,0x12c89c);
          lVar12 = std::__cxx11::string::find((char *)str,0x12c89f);
          if ((lVar12 == -1) || (lVar11 == -1)) break;
          std::__cxx11::string::substr((ulong)local_58,(ulong)str);
          std::__cxx11::string::substr((ulong)local_a0,(ulong)str);
          std::operator+((string *)local_9f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0);
          std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
          std::__cxx11::string::~string((string *)local_9f0);
          std::__cxx11::string::~string((string *)local_a0);
          std::__cxx11::string::~string((string *)local_58);
        }
        if (!bVar4) {
          if (lVar11 == -1) goto LAB_00126111;
          std::__cxx11::string::substr((ulong)local_9f0,(ulong)str);
          std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
          std::__cxx11::string::~string((string *)local_9f0);
          bVar4 = true;
          goto LAB_0012611c;
        }
      } while (lVar12 == -1);
      std::__cxx11::string::substr((ulong)local_9f0,(ulong)str);
      std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
      std::__cxx11::string::~string((string *)local_9f0);
LAB_00126111:
      bVar4 = false;
LAB_0012611c:
      std::__cxx11::string::string((string *)&local_7e8,(string *)str);
      replaceChar((string *)local_9f0,&local_7e8,'\t',' ');
      std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
      std::__cxx11::string::~string((string *)local_9f0);
      std::__cxx11::string::~string((string *)&local_7e8);
      lVar11 = std::__cxx11::string::find((char *)str,0x12c8a2);
      if (lVar11 == 0) {
        readQuote((string *)local_a0,str);
        std::operator+((string *)local_9f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,(string *)local_a0);
        std::operator+(&local_768,(string *)local_9f0,".as");
        normalize_path((string *)local_58,&local_768,false);
        std::__cxx11::string::~string((string *)&local_768);
        std::__cxx11::string::~string((string *)local_9f0);
        std::__cxx11::string::~string((string *)local_a0);
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)sprite_val.field_2._8_8_,(string *)local_58);
        if ((_Rb_tree_header *)iVar13._M_node ==
            &(searchedScripts->_M_t)._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)sprite_val.field_2._8_8_,(string *)local_58);
          std::__cxx11::string::string((string *)&local_748,(string *)local_58);
          push_unique((set_icase *)include.field_2._8_8_,&local_748);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::string::string((string *)&local_728,(string *)local_58);
          get_script_dependencies
                    ((set_icase *)local_9f0,&local_728,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)sprite_val.field_2._8_8_,hud_files);
          std::__cxx11::string::~string((string *)&local_728);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
                      *)include.field_2._8_8_,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Base_ptr)&includeRes);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_9f0);
        }
        std::__cxx11::string::~string((string *)local_58);
      }
    } while (lVar9 != -1);
    std::__cxx11::string::string((string *)local_9f0,(string *)str);
    auStack_148 = (undefined1  [8])0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while ((includeRes._M_t._M_impl._0_8_ != 0 &&
           (uVar14 = std::__cxx11::string::find((char *)local_9f0,0x12b972),
           uVar14 < includeRes._M_t._M_impl._0_8_ - 1))) {
      std::__cxx11::string::find((char *)local_9f0,0x12b972);
      std::__cxx11::string::substr((ulong)local_58,(ulong)local_9f0);
      std::__cxx11::string::operator=((string *)local_9f0,(string *)local_58);
      std::__cxx11::string::~string((string *)local_58);
      lVar11 = std::__cxx11::string::find((char *)local_9f0,0x12b972);
      if (lVar11 == -1) break;
      std::__cxx11::string::find((char *)local_9f0,0x12b972);
      std::__cxx11::string::substr((ulong)local_58,(ulong)local_9f0);
      std::__cxx11::string::string((string *)&local_708,(string *)local_58);
      get_ext((string *)local_a0,&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      std::__cxx11::string::find((char *)local_9f0,0x12b972);
      uVar16 = 0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)local_f0,(ulong)local_9f0);
      std::__cxx11::string::operator=((string *)local_9f0,(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      if (include._M_dataplus._M_p != ext._M_dataplus._M_p + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_148,(value_type *)local_58);
        std::__cxx11::string::string((string *)&local_528,(string *)local_58);
        normalize_path((string *)local_f0,&local_528,false);
        std::__cxx11::string::~string((string *)&local_528);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&tmpVal.field_2 + 8),"sound/",(string *)local_f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,"sprites/",(string *)local_f0);
        std::__cxx11::string::string((string *)&local_508,(string *)local_f0);
        bVar5 = is_default_file(&local_508);
        bVar6 = true;
        if (!bVar5) {
          bVar6 = contentExists((string *)local_f0,false,&dummy_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::string
                  ((string *)&local_4e8,(string *)(tmpVal.field_2._M_local_buf + 8));
        bVar5 = is_default_file(&local_4e8);
        bVar7 = true;
        if (!bVar5) {
          bVar7 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,&dummy_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::string((string *)&local_2c8,(string *)local_120);
        bVar5 = is_default_file(&local_2c8);
        uVar14 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
        if (!bVar5) {
          bVar5 = contentExists((string *)local_120,false,&dummy_abi_cxx11_);
          uVar14 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
        }
        uVar17 = uVar14;
        std::__cxx11::string::~string((string *)&local_2c8);
        concatVal.field_2._12_4_ = (undefined4)uVar14;
        if (((char)uVar14 == '\0') &&
           ((bVar6 == false && bVar7 == false) &&
            0x20 < (ulong)((long)values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148))) {
          std::__cxx11::string::string
                    ((string *)(ext.field_2._M_local_buf + 8),"",
                     (allocator *)
                     &ret2.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          for (uVar14 = 0;
              uVar14 < (ulong)((long)values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148
                              >> 5); uVar14 = uVar14 + 1) {
            std::__cxx11::string::append((string *)(ext.field_2._M_local_buf + 8));
          }
          bVar5 = contentExists((string *)((long)&ext.field_2 + 8),false,&dummy_abi_cxx11_);
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)local_58);
            std::__cxx11::string::string((string *)&local_4c8,(string *)local_58);
            ppbVar2 = &ret2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            normalize_path((string *)ppbVar2,&local_4c8,false);
            std::__cxx11::string::operator=((string *)local_f0,(string *)ppbVar2);
            std::__cxx11::string::~string((string *)ppbVar2);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ppbVar2,"sound/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0);
            std::__cxx11::string::operator=
                      ((string *)(tmpVal.field_2._M_local_buf + 8),(string *)ppbVar2);
            std::__cxx11::string::~string((string *)ppbVar2);
            std::__cxx11::string::string((string *)&local_2a8,(string *)local_f0);
            bVar5 = is_default_file(&local_2a8);
            if (!bVar5) {
              contentExists((string *)local_f0,false,&dummy_abi_cxx11_);
            }
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::string::string
                      ((string *)&local_288,(string *)(tmpVal.field_2._M_local_buf + 8));
            bVar5 = is_default_file(&local_288);
            bVar7 = true;
            if (!bVar5) {
              bVar7 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,&dummy_abi_cxx11_);
            }
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::string((string *)&local_268,(string *)local_120);
            bVar5 = is_default_file(&local_268);
            uVar15 = (undefined4)CONCAT71((int7)(uVar17 >> 8),1);
            if (!bVar5) {
              bVar5 = contentExists((string *)local_120,false,&dummy_abi_cxx11_);
              uVar15 = (undefined4)CONCAT71(extraout_var_00,bVar5);
            }
            concatVal.field_2._12_4_ = uVar15;
            std::__cxx11::string::~string((string *)&local_268);
          }
          else {
            bVar7 = false;
            concatVal.field_2._12_4_ = 0;
          }
          std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
        }
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"mdl");
        if (bVar5) {
          std::__cxx11::string::string((string *)&local_248,(string *)local_58);
          normalize_path(&local_4a8,&local_248,false);
          std::__cxx11::string::string
                    ((string *)&local_6e8,
                     (string *)
                     &parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          add_model_resources(&local_4a8,(set_icase *)include.field_2._8_8_,&local_6e8);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_4a8);
          psVar19 = &local_248;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"spr");
          if (bVar5) {
            psVar18 = (string *)local_58;
            if (concatVal.field_2._M_local_buf[0xc] != '\0') {
              psVar18 = (string *)local_120;
            }
            std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8),psVar18);
            std::__cxx11::string::string
                      ((string *)&local_488,(string *)(ext.field_2._M_local_buf + 8));
            ppbVar2 = &ret2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            normalize_path((string *)ppbVar2,&local_488,false);
            std::__cxx11::string::operator=((string *)local_58,(string *)ppbVar2);
            std::__cxx11::string::~string((string *)ppbVar2);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::string((string *)&local_468,(string *)local_58);
            std::__cxx11::string::string
                      ((string *)&local_6c8,
                       (string *)
                       &parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            trace_missing_file(&local_468,&local_6c8,true);
            std::__cxx11::string::~string((string *)&local_6c8);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::string((string *)&local_448,(string *)local_58);
            psVar19 = &local_448;
            push_unique((set_icase *)include.field_2._8_8_,psVar19);
          }
          else {
            psVar18 = (string *)local_58;
            if (bVar7 != false) {
              psVar18 = (string *)(tmpVal.field_2._M_local_buf + 8);
            }
            std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8),psVar18);
            std::__cxx11::string::string
                      ((string *)&local_6a8,(string *)(ext.field_2._M_local_buf + 8));
            ppbVar2 = &ret2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            normalize_path((string *)ppbVar2,&local_6a8,false);
            std::__cxx11::string::operator=((string *)local_58,(string *)ppbVar2);
            std::__cxx11::string::~string((string *)ppbVar2);
            std::__cxx11::string::~string((string *)&local_6a8);
            lVar11 = 0;
            do {
              if (lVar11 == 0x58) goto LAB_001269a2;
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,
                                      (char *)((long)&_ZL12g_valid_exts_rel +
                                              (long)*(int *)((long)&_ZL12g_valid_exts_rel + lVar11))
                                     );
              lVar11 = lVar11 + 4;
            } while (!bVar5);
            std::__cxx11::string::string((string *)&local_428,(string *)local_58);
            std::__cxx11::string::string
                      ((string *)&local_688,
                       (string *)
                       &parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            trace_missing_file(&local_428,&local_688,true);
            std::__cxx11::string::~string((string *)&local_688);
            std::__cxx11::string::~string((string *)&local_428);
            std::__cxx11::string::string((string *)&local_408,(string *)local_58);
            psVar19 = &local_408;
            push_unique((set_icase *)include.field_2._8_8_,psVar19);
          }
          std::__cxx11::string::~string((string *)psVar19);
LAB_001269a2:
          psVar19 = (string *)(ext.field_2._M_local_buf + 8);
        }
        std::__cxx11::string::~string((string *)psVar19);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string((string *)(tmpVal.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_f0);
      }
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_58);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_148);
    std::__cxx11::string::~string((string *)local_9f0);
    lVar11 = std::__cxx11::string::find((char *)str,0x12c8ab);
    if (lVar11 != -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "ERROR: Failed to parse custom weapon definition in ",fname);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     " (line ");
      psVar19 = (string *)((long)&tmpVal.field_2 + 8);
      std::__cxx11::to_string(psVar19,local_a8);
      std::operator+((string *)local_9f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     psVar19);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (string *)local_9f0,")\n");
      std::__cxx11::string::~string((string *)local_9f0);
      std::__cxx11::string::~string((string *)(tmpVal.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::find((char *)str,0x12c8ab);
      std::__cxx11::string::string
                ((string *)local_a0,"g_ItemRegistry.RegisterWeapon(",(allocator *)local_f0);
      std::__cxx11::string::substr((ulong)local_9f0,(ulong)str);
      std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
      std::__cxx11::string::~string((string *)local_9f0);
      std::__cxx11::string::~string((string *)local_a0);
      iVar8 = std::__cxx11::string::find_first_of((char *)str,0x12c6d0);
      if ((pointer)(long)iVar8 < line._M_dataplus._M_p + -1) {
        std::__cxx11::string::substr((ulong)&local_648,(ulong)str);
        trimSpaces((string *)local_a0,&local_648);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::substr((ulong)local_9f0,(ulong)str);
        std::__cxx11::string::operator=((string *)str,(string *)local_9f0);
        std::__cxx11::string::~string((string *)local_9f0);
        iVar8 = std::__cxx11::string::find_first_of((char *)str,0x12c6d0);
        if (iVar8 == -1) {
          iVar8 = std::__cxx11::string::find_last_of((char *)str,0x12be16);
        }
        if ((pointer)(long)iVar8 < line._M_dataplus._M_p + -1) {
          std::__cxx11::string::substr((ulong)&local_608,(ulong)str);
          trimSpaces((string *)local_f0,&local_608);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::string((string *)&local_3e8,(string *)local_a0);
          std::__cxx11::string::string((string *)&local_3c8,(string *)fname);
          std::__cxx11::string::string((string *)&local_5e8,(string *)local_58);
          parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&trace.field_2 + 8),&local_3e8,&local_3c8,&local_5e8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::string((string *)&local_3a8,(string *)local_f0);
          std::__cxx11::string::string((string *)&local_388,(string *)fname);
          std::__cxx11::string::string((string *)&local_5c8,(string *)local_58);
          parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_188,&local_3a8,&local_388,&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3a8);
          if ((ret1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)trace.field_2._8_8_) &&
             ((undefined1  [8])
              ret2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != local_188)) {
            if (((ulong)((long)ret1.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - trace.field_2._8_8_) <
                 0x21) &&
               ((ulong)((long)ret2.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)local_188) < 0x21))
            {
              std::__cxx11::string::_M_assign((string *)local_a0);
              std::__cxx11::string::_M_assign((string *)local_f0);
              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&ext.field_2 + 8);
              std::operator+(pbVar20,"sprites/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,pbVar20,"/");
              std::operator+((string *)local_9f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (tmpVal.field_2._M_local_buf + 8),(string *)local_9f0,".txt");
              std::__cxx11::string::~string((string *)local_9f0);
              std::__cxx11::string::~string((string *)local_120);
              std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
              std::__cxx11::string::string
                        ((string *)&local_348,(string *)(tmpVal.field_2._M_local_buf + 8));
              std::__cxx11::string::string
                        ((string *)&local_5a8,
                         (string *)
                         &parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              trace_missing_file(&local_348,&local_5a8,true);
              std::__cxx11::string::~string((string *)&local_5a8);
              std::__cxx11::string::~string((string *)&local_348);
              std::__cxx11::string::string
                        ((string *)&local_328,(string *)(tmpVal.field_2._M_local_buf + 8));
              push_unique(hud_files,&local_328);
              std::__cxx11::string::~string((string *)&local_328);
              std::__cxx11::string::string
                        ((string *)local_120,(string *)(tmpVal.field_2._M_local_buf + 8));
              bVar5 = contentExists((string *)local_120,true,&dummy_abi_cxx11_);
              if (bVar5) {
                std::ifstream::ifstream((string *)local_9f0,(string *)local_120,_S_in);
                cVar3 = std::__basic_file<char>::is_open();
                if (cVar3 != '\0') {
                  ext.field_2._8_8_ = &concatVal._M_string_length;
                  concatVal._M_dataplus._M_p = (pointer)0x0;
                  concatVal._M_string_length._0_1_ = 0;
                  while (piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                             ((istream *)local_9f0,
                                              (string *)(ext.field_2._M_local_buf + 8)),
                        ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
                    psVar18 = (string *)(ext.field_2._M_local_buf + 8);
                    lVar11 = std::__cxx11::string::find((char *)psVar18,0x12b2c2);
                    if (lVar11 != -1) {
                      ppbVar2 = &ret2.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      std::__cxx11::string::substr((ulong)ppbVar2,(ulong)psVar18);
                      std::__cxx11::string::operator=(psVar18,(string *)ppbVar2);
                      std::__cxx11::string::~string((string *)ppbVar2);
                    }
                    std::__cxx11::string::string((string *)&local_588,psVar18);
                    ppbVar2 = &ret2.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    trimSpaces((string *)ppbVar2,&local_588);
                    std::__cxx11::string::operator=(psVar18,(string *)ppbVar2);
                    std::__cxx11::string::~string((string *)ppbVar2);
                    std::__cxx11::string::~string((string *)&local_588);
                    std::__cxx11::string::string((string *)&local_7c8,psVar18);
                    replaceChar((string *)ppbVar2,&local_7c8,'\t',' ');
                    std::__cxx11::string::operator=(psVar18,(string *)ppbVar2);
                    std::__cxx11::string::~string((string *)ppbVar2);
                    std::__cxx11::string::~string((string *)&local_7c8);
                    std::__cxx11::string::string((string *)&local_568,psVar18);
                    splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&line.field_2 + 8),&local_568," ");
                    std::__cxx11::string::~string((string *)&local_568);
                    if (0x40 < (ulong)((long)parts.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      line.field_2._8_8_)) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_148,"sprites/",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(line.field_2._8_8_ + 0x40));
                      ppbVar2 = &ret2.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)ppbVar2,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_148,".spr");
                      std::__cxx11::string::~string((string *)auStack_148);
                      std::__cxx11::string::string((string *)&local_308,(string *)ppbVar2);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_148,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&parts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage," --> ")
                      ;
                      std::operator+(&local_548,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_148,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&tmpVal.field_2 + 8));
                      trace_missing_file(&local_308,&local_548,true);
                      std::__cxx11::string::~string((string *)&local_548);
                      std::__cxx11::string::~string((string *)auStack_148);
                      std::__cxx11::string::~string((string *)&local_308);
                      std::__cxx11::string::string
                                ((string *)&local_2e8,
                                 (string *)
                                 &ret2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      push_unique((set_icase *)include.field_2._8_8_,&local_2e8);
                      std::__cxx11::string::~string((string *)&local_2e8);
                      std::__cxx11::string::~string
                                ((string *)
                                 &ret2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&line.field_2 + 8));
                  }
                  std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
                }
                std::ifstream::close();
                std::ifstream::~ifstream((string *)local_9f0);
              }
              std::__cxx11::string::~string((string *)local_120);
              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (tmpVal.field_2._M_local_buf + 8);
            }
            else {
              std::operator+(&local_368,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,
                             "\t Reason: array argument(s) with variable index not handled\n");
              pbVar20 = &local_368;
              log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            }
            std::__cxx11::string::~string((string *)pbVar20);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_188);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&trace.field_2 + 8));
          pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
        }
        else {
          pbVar20 = &local_628;
          std::operator+(pbVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_58,
                         "\t Reason: couldn\'t find all arguments on this line\n");
          log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        }
        std::__cxx11::string::~string((string *)pbVar20);
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      }
      else {
        pbVar20 = &local_668;
        std::operator+(pbVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58,"\t Reason: couldn\'t find all arguments on this line\n");
        log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      }
      std::__cxx11::string::~string((string *)pbVar20);
      std::__cxx11::string::~string((string *)local_58);
    }
  } while( true );
}

Assistant:

set_icase get_script_dependencies(string fname, set<string>& searchedScripts, set_icase& hud_files)
{
	set_icase resources;

	string folder = "scripts/maps/";

	// ignore sounds/models in this script. They're false positives.
	bool isWeaponCustom = toLowerCase(fname).find("weapon_custom.as") != string::npos;

	int idir = fname.find_last_of("/\\");
	if (idir != string::npos && idir > folder.length())
		folder = fname.substr(0, idir) + '/';

	contentExists(fname, true); // fix caps

	string trace = fname;

	ifstream myfile(fname);
	if (myfile.is_open())
	{
		int lineNum = 0;
		bool inCommentBlock = false;
		string line;
		while (getline(myfile, line))
		{
			lineNum++;

			line = trimSpaces(line);
			if (line.find("//") == 0)
				continue;
			
			// check for block comments
			{	
				size_t commentStart = line.find("/*");
				size_t commentEnd = line.find("*/");

				// remove inline block comments
				while (commentStart != string::npos && commentEnd != string::npos)
				{
					line = line.substr(0, commentStart) + line.substr(commentEnd+2);
					commentStart = line.find("/*");
					commentEnd = line.find("*/");
				}

				// ignore lines contained in comment blocks
				if (inCommentBlock)
				{
					if (commentEnd != string::npos)
					{
						inCommentBlock = false;
						line = line.substr(commentEnd+2);
						commentStart = commentEnd = string::npos;
					}
					else
						continue;
				}				
				else if (commentStart != string::npos)
				{
					line = line.substr(0, commentStart);
					inCommentBlock = true;
				}
			}

			line = replaceChar(line, '\t', ' ' );
			
			if (line.find("#include") == 0) 
			{
				// .as extension is optional in cfg file, but required to be ommitted in #include statements
				string include = normalize_path(folder + readQuote(line) + ".as");
				if (searchedScripts.find(include) == searchedScripts.end())
				{
					searchedScripts.insert(include);
					push_unique(resources, include);
					set_icase includeRes = get_script_dependencies(include, searchedScripts, hud_files);
					resources.insert(includeRes.begin(), includeRes.end());
				}
			}

			// look for string literals
			if (!isWeaponCustom) {
				string s = line;
				vector<string> values;
				while (s.length())
				{
					if (s.find("\"") >= s.length() - 1)
						break;
					s = s.substr(s.find("\"") + 1);

					if (s.find("\"") == string::npos)
						break;

					string val = s.substr(0, s.find("\""));
					string ext = get_ext(val);

					s = s.substr(s.find("\"")+1);	

					if (val.length() == ext.length() + 1)
						continue; // probably a path constructed from vars

					values.push_back(val);

					// handle case where the full path is broken up into separate string literals for no reason
					string tmpVal = normalize_path(val);
					string sound_val = "sound/" + tmpVal;
					string sprite_val = "sprites/" + tmpVal;
					bool valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
					bool soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
					bool spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
					if (values.size() > 1 && !valExists && !soundValExists && !spriteValExists)
					{
						string concatVal = "";
						for (int i = 0; i < values.size(); i++)
							concatVal += values[i];
						if (contentExists(concatVal, false))
						{
							val = concatVal;
							
							tmpVal = normalize_path(val);
							sound_val = "sound/" + tmpVal;
							valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
							soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
							spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
						}
					}

					if (ext == "mdl")
					{
						add_model_resources(normalize_path(val), resources, trace);
					}
					else if (ext == "spr")
					{
						// sprites/ prefix is optional for HUD parameters
						string valpath = spriteValExists ? sprite_val : val;

						val = normalize_path(valpath);
						trace_missing_file(val, trace, true);
						push_unique(resources, val);
					}
					else
					{
						// probably safe to assume the script is using sounds correctly,
						// so it's ok if the prefix is missing. Just try to find a plausible match.
						// There will be too many false positives otherwise.
						string valpath = soundValExists ? sound_val : val;
						
						val = normalize_path(valpath);
						for (int k = 0; k < NUM_SOUND_EXTS; k++)
						{
							if (ext == g_valid_exts[k])
							{
								trace_missing_file(val, trace, true);
								push_unique(resources, val);
								break;
							}
						}
					}
				}
				
			}

			// try to parse out custom weapon sprite files
			if (!isWeaponCustom && line.find("g_ItemRegistry.RegisterWeapon(") != string::npos)
			{
				string err = "ERROR: Failed to parse custom weapon definition in " + fname + " (line " + to_string(lineNum) + ")\n";
				line = line.substr(line.find("g_ItemRegistry.RegisterWeapon(") + string("g_ItemRegistry.RegisterWeapon(").length());
				int comma = line.find_first_of(",");
				if (comma >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg1 = trimSpaces(line.substr(0, comma));

				line = line.substr(comma+1);
				int comma2 = line.find_first_of(",");
				if (comma2 == string::npos)
					comma2 = line.find_last_of(")"); // third arg is optional
				if (comma2 >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg2 = trimSpaces(line.substr(0, comma2));

				vector<string> ret1 = parse_script_arg(arg1, fname, err);
				vector<string> ret2 = parse_script_arg(arg2, fname, err);

				if (ret1.size() == 0 || ret2.size() == 0)
					continue;

				if (ret1.size() > 1 || ret2.size() > 1)
				{
					log(err + "\t Reason: array argument(s) with variable index not handled\n");
					continue;
				}

				arg1 = ret1[0];
				arg2 = ret2[0];

				// Note: code duplicated in Bsp.cpp (weapon_custom)
				string hud_file = "sprites/" + arg2 + "/" + arg1 + ".txt";
				trace_missing_file(hud_file, trace, true);
				push_unique(hud_files, hud_file);

				string hud_path = hud_file;
				if (contentExists(hud_path, true))
				{
					ifstream file(hud_path);
					if (file.is_open())
					{
						int lineNum = 0;
						bool in_func_body = false;
						string line;
						while (getline(file, line))
						{
							lineNum++;

							// strip comments
							size_t cpos = line.find("//");
							if (cpos != string::npos)
								line = line.substr(0, cpos);

							line = trimSpaces(line);

							line = replaceChar(line, '\t', ' ');
							vector<string> parts = splitString(line, " ");

							if (parts.size() < 3)
								continue;
							
							string spr = "sprites/" + parts[2] + ".spr";
							trace_missing_file(spr, trace + " --> " + hud_file, true);
							push_unique(resources, spr);
						}
					}
					file.close();
				}
			}
		}
	}
	//else
	//	cout << "Failed to open: " << fname << endl; // not needed - file will be flagged as missing later
	myfile.close();

	return resources;
}